

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SqueezeLayerParams::InternalSwap
          (SqueezeLayerParams *this,SqueezeLayerParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar6 = (this->axes_).current_size_;
  iVar7 = (this->axes_).total_size_;
  pvVar3 = (this->axes_).arena_or_elements_;
  iVar5 = (other->axes_).total_size_;
  pvVar4 = (other->axes_).arena_or_elements_;
  (this->axes_).current_size_ = (other->axes_).current_size_;
  (this->axes_).total_size_ = iVar5;
  (this->axes_).arena_or_elements_ = pvVar4;
  (other->axes_).current_size_ = iVar6;
  (other->axes_).total_size_ = iVar7;
  (other->axes_).arena_or_elements_ = pvVar3;
  bVar1 = this->squeezeall_;
  this->squeezeall_ = other->squeezeall_;
  other->squeezeall_ = bVar1;
  return;
}

Assistant:

void SqueezeLayerParams::InternalSwap(SqueezeLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axes_.InternalSwap(&other->axes_);
  swap(squeezeall_, other->squeezeall_);
}